

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

bool int_check_event(Am_Object *inter,Am_Object *event_window,Am_Input_Char input_char,
                    Am_Slot_Key when_slot,Am_Value *slot_value,Am_Input_Char *deferred)

{
  ushort uVar1;
  bool bVar2;
  long lVar3;
  char *s;
  ostream *poVar4;
  uint uVar5;
  Am_Input_Char extraout_EDX;
  Am_Input_Char AVar6;
  Am_Input_Char extraout_EDX_00;
  bool bVar7;
  Am_Input_Char local_64;
  Am_Object local_60;
  Am_Object local_58;
  Am_Event_Method method;
  Am_String sval;
  
  Am_Input_Char::Am_Input_Char(&local_64,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  bVar2 = Am_Value::Valid(slot_value);
  if (!bVar2) {
    return false;
  }
  uVar1 = slot_value->type;
  if ((uVar1 & 0xfffe) == 2) {
    lVar3 = Am_Value::operator_cast_to_long(slot_value);
    return lVar3 != 0;
  }
  if (uVar1 == Am_Input_Char::Am_Input_Char_ID) {
    lVar3 = (slot_value->value).long_value;
    local_64._2_2_ = (ushort)((ulong)lVar3 >> 0x10) & 0xfff | local_64._2_2_ & 0xf000;
    local_64.code = (short)lVar3;
    bVar2 = ((uint)input_char & 0xffff) != 0x103;
    bVar7 = ((uint)lVar3 & 0xffff) == 0x103;
    AVar6._1_3_ = (int3)(((uint)input_char & 0xffff) >> 8);
    AVar6.code._0_1_ = bVar2 && bVar7 || !bVar2 && !bVar7;
    if (((!bVar2 || !bVar7) && (bVar2 || bVar7)) &&
       (bVar2 = Am_Input_Char::helper_check_equal(&local_64,input_char), AVar6 = extraout_EDX, bVar2
       )) {
      return true;
    }
    bVar2 = check_deferring_event((Am_Object *)(ulong)(uint)local_64,input_char,AVar6);
    if (bVar2) {
      Am_Input_Char::operator=(deferred,&local_64);
      return true;
    }
    return false;
  }
  if (uVar1 != 0x8008) {
    if (uVar1 == 4) {
      bVar2 = Am_Value::operator_cast_to_bool(slot_value);
      return bVar2;
    }
    if ((((slot_value->value).method_value != (Am_Method_Wrapper *)0x0) &&
        (uVar1 == Am_Event_Method::Am_Event_Method_ID)) &&
       (((slot_value->value).method_value)->Call != (Am_Generic_Procedure *)0x0)) {
      Am_Event_Method::Am_Event_Method(&method,slot_value);
      Am_Object::Am_Object(&local_58,inter);
      Am_Object::Am_Object(&local_60,event_window);
      bVar2 = (*method.Call)((Am_Object_Data *)&local_58,(Am_Object_Data *)&local_60,input_char);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&local_58);
      return bVar2;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar4 = std::operator<<(poVar4,"Type of value in when slot is ");
    poVar4 = operator<<(poVar4,slot_value);
    poVar4 = std::operator<<(poVar4," but should be a bool, string, Am_Input_Char or Am_Value_List")
    ;
    std::endl<char,std::char_traits<char>>(poVar4);
    Am_Error();
  }
  sval.data = (Am_String_Data *)0x0;
  Am_String::operator=(&sval,slot_value);
  s = Am_String::operator_cast_to_char_(&sval);
  Am_Input_Char::Am_Input_Char((Am_Input_Char *)&method,s,true);
  local_64._2_2_ = method.from_wrapper._2_2_ & 0xfff | local_64._2_2_ & 0xf000;
  local_64.code = (short)method.from_wrapper;
  if (when_slot != 0) {
    Am_Input_Char::operator_cast_to_Am_Value(&local_64);
    Am_Object::Set(inter,when_slot,(Am_Value *)&method,0x10000);
    Am_Value::~Am_Value((Am_Value *)&method);
    method.from_wrapper._0_2_ = local_64.code;
  }
  uVar5 = (uint)input_char & 0xffff;
  AVar6 = (Am_Input_Char)
          (CONCAT31((int3)(uVar5 >> 8),uVar5 != 0x103 || (short)method.from_wrapper == 0x103) ^ 1);
  if ((uVar5 == 0x103 || (short)method.from_wrapper != 0x103) && (char)AVar6.code == '\0') {
    bVar2 = Am_Input_Char::helper_check_equal(&local_64,input_char);
    bVar7 = true;
    AVar6 = extraout_EDX_00;
    if (bVar2) goto LAB_001b20d4;
  }
  bVar2 = check_deferring_event((Am_Object *)(ulong)(uint)local_64,input_char,AVar6);
  if (bVar2) {
    Am_Input_Char::operator=(deferred,&local_64);
    bVar7 = true;
  }
  else {
    bVar7 = false;
  }
LAB_001b20d4:
  Am_String::~Am_String(&sval);
  return bVar7;
}

Assistant:

static bool
int_check_event(Am_Object &inter, Am_Object &event_window,
                Am_Input_Char input_char, Am_Slot_Key when_slot,
                Am_Value &slot_value, Am_Input_Char &deferred)
{
  bool result = false;
  Am_Input_Char target_char;
  if (!slot_value.Valid()) {
    // luckily 0 and (0L) are illegal Am_Input_Char so can use as false
    result = false;
  } else if ((slot_value.type == Am_INT) || (slot_value.type == Am_LONG)) {
    long val = slot_value;
    // first test if event is true or false (for always or never)
    result = (val != 0);
  } else if (slot_value.type == Am_Input_Char::Type_ID()) {
    target_char = slot_value;
    Am_INTER_TRACE_PRINT_NOENDL(inter, target_char);
    // now do comparison
    result = (target_char == input_char);
    if (!result) {
      result = check_deferring_event(inter, target_char, input_char);
      if (result)
        deferred = target_char;
    }
  } else if (slot_value.type == Am_BOOL)
    result = slot_value;
  else if (slot_value.type == Am_STRING) {
    // convert string into right type
    Am_String sval;
    sval = slot_value;
    target_char = Am_Input_Char((const char *)sval);
    Am_INTER_TRACE_PRINT_NOENDL(inter, (const char *)sval
                                           << " (str--converted to Input_Char)="
                                           << target_char);
    if (when_slot) { //otherwise is part of a list, so leave it alone
      // store it back into the slot so more efficient next time
      // (because no parsing will be needed next time)
      //don't delete the constraint in the slot, if any
      inter.Set(when_slot, target_char, Am_KEEP_FORMULAS);
    }
    // now do comparison
    result = (target_char == input_char);
    if (!result) {
      result = check_deferring_event(inter, target_char, input_char);
      if (result)
        deferred = target_char;
    }
  } else if (Am_Event_Method::Test(slot_value)) {
    Am_Event_Method method(slot_value);
    result = method.Call(inter, event_window, input_char);
  } else {
    Am_ERRORO(
        "Type of value in when slot is "
            << slot_value
            << " but should be a bool, string, Am_Input_Char or Am_Value_List",
        inter, when_slot);
  }

// here have result set
#ifdef DEBUG
  if (Am_Inter_Tracing(inter)) {
    if (result)
      std::cout << " * SUCCESS\n" << std::flush;
    else
      std::cout << " * FAILED\n" << std::flush;
  }
#endif
  return result;
}